

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int xmlParseElementStart(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  xmlDocPtr doc;
  xmlChar *pxVar2;
  _xmlSAXHandler *p_Var3;
  xmlChar *pxVar4;
  uint uVar5;
  xmlChar *value;
  _xmlNode *p_Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlChar *URI;
  xmlChar *prefix;
  _xmlNode *local_70;
  xmlChar *local_68;
  int local_5c;
  xmlParserNodeInfo node_info;
  
  prefix = (xmlChar *)0x0;
  URI = (xmlChar *)0x0;
  iVar9 = ctxt->nsNr;
  if ((xmlParserMaxDepth < (uint)ctxt->nameNr) && ((ctxt->options & 0x80000) == 0)) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_INTERNAL_ERROR,
                      "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
                      xmlParserMaxDepth);
    xmlHaltParser(ctxt);
    iVar7 = -1;
  }
  else {
    if (ctxt->record_info != 0) {
      pxVar1 = ctxt->input;
      node_info.begin_pos = (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
      node_info.begin_line = (unsigned_long)pxVar1->line;
    }
    if (ctxt->spaceNr == 0) {
      iVar8 = -1;
    }
    else {
      iVar8 = -1;
      if (*ctxt->space != -2) {
        iVar8 = *ctxt->space;
      }
    }
    spacePush(ctxt,iVar8);
    iVar8 = ctxt->input->line;
    if (ctxt->sax2 == 0) {
      value = xmlParseStartTag(ctxt);
    }
    else {
      value = xmlParseStartTag2(ctxt,&prefix,&URI,&local_5c);
    }
    pxVar4 = URI;
    iVar7 = -1;
    if (ctxt->instate != XML_PARSER_EOF) {
      if (value == (xmlChar *)0x0) {
        spacePop(ctxt);
      }
      else {
        local_68 = prefix;
        nameNsPush(ctxt,value,prefix,URI,iVar8,ctxt->nsNr - iVar9);
        p_Var6 = ctxt->node;
        if ((((ctxt->validate != 0) && (ctxt->wellFormed != 0)) &&
            (doc = ctxt->myDoc, p_Var6 != (_xmlNode *)0x0 && doc != (xmlDocPtr)0x0)) &&
           (p_Var6 == doc->children)) {
          local_70 = p_Var6;
          uVar5 = xmlValidateRoot(&ctxt->vctxt,doc);
          ctxt->valid = ctxt->valid & uVar5;
          p_Var6 = local_70;
        }
        pxVar1 = ctxt->input;
        pxVar2 = pxVar1->cur;
        if (*pxVar2 == '>') {
          pxVar1->col = pxVar1->col + 1;
          pxVar1->cur = pxVar2 + 1;
          iVar7 = 0;
          if (pxVar2[1] == '\0') {
            xmlParserInputGrow(pxVar1,0xfa);
          }
        }
        else {
          if ((*pxVar2 == '/') && (pxVar2[1] == '>')) {
            pxVar1->cur = pxVar2 + 2;
            pxVar1->col = pxVar1->col + 2;
            if (pxVar2[2] == '\0') {
              xmlParserInputGrow(pxVar1,0xfa);
            }
            p_Var3 = ctxt->sax;
            if (ctxt->sax2 == 0) {
              if (((p_Var3 != (_xmlSAXHandler *)0x0) &&
                  (p_Var3->endElement != (endElementSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                (*p_Var3->endElement)(ctxt->userData,value);
              }
            }
            else if (((p_Var3 != (_xmlSAXHandler *)0x0) &&
                     (p_Var3->endElementNs != (endElementNsSAX2Func)0x0)) && (ctxt->disableSAX == 0)
                    ) {
              (*p_Var3->endElementNs)(ctxt->userData,value,local_68,pxVar4);
            }
            namePop(ctxt);
            spacePop(ctxt);
            iVar9 = ctxt->nsNr - iVar9;
            if (iVar9 != 0) {
              nsPop(ctxt,iVar9);
            }
            iVar7 = 1;
            if (p_Var6 == (_xmlNode *)0x0) {
              return 1;
            }
            if (ctxt->record_info == 0) {
              return 1;
            }
            pxVar1 = ctxt->input;
            node_info.end_pos =
                 (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
            iVar9 = pxVar1->line;
          }
          else {
            xmlFatalErrMsgStrIntStr
                      (ctxt,XML_ERR_GT_REQUIRED,"Couldn\'t find end of Start Tag %s line %d\n",value
                       ,iVar8,(xmlChar *)0x0);
            nodePop(ctxt);
            namePop(ctxt);
            spacePop(ctxt);
            iVar9 = ctxt->nsNr - iVar9;
            if (iVar9 != 0) {
              nsPop(ctxt,iVar9);
            }
            if (p_Var6 == (_xmlNode *)0x0) {
              return -1;
            }
            if (ctxt->record_info == 0) {
              return -1;
            }
            pxVar1 = ctxt->input;
            node_info.end_pos =
                 (unsigned_long)(pxVar1->cur + (pxVar1->consumed - (long)pxVar1->base));
            iVar9 = pxVar1->line;
          }
          node_info.end_line = (unsigned_long)iVar9;
          node_info.node = p_Var6;
          xmlParserAddNodeInfo(ctxt,&node_info);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int
xmlParseElementStart(xmlParserCtxtPtr ctxt) {
    const xmlChar *name;
    const xmlChar *prefix = NULL;
    const xmlChar *URI = NULL;
    xmlParserNodeInfo node_info;
    int line, tlen = 0;
    xmlNodePtr ret;
    int nsNr = ctxt->nsNr;

    if (((unsigned int) ctxt->nameNr > xmlParserMaxDepth) &&
        ((ctxt->options & XML_PARSE_HUGE) == 0)) {
	xmlFatalErrMsgInt(ctxt, XML_ERR_INTERNAL_ERROR,
		 "Excessive depth in document: %d use XML_PARSE_HUGE option\n",
			  xmlParserMaxDepth);
	xmlHaltParser(ctxt);
	return(-1);
    }

    /* Capture start position */
    if (ctxt->record_info) {
        node_info.begin_pos = ctxt->input->consumed +
                          (CUR_PTR - ctxt->input->base);
	node_info.begin_line = ctxt->input->line;
    }

    if (ctxt->spaceNr == 0)
	spacePush(ctxt, -1);
    else if (*ctxt->space == -2)
	spacePush(ctxt, -1);
    else
	spacePush(ctxt, *ctxt->space);

    line = ctxt->input->line;
#ifdef LIBXML_SAX1_ENABLED
    if (ctxt->sax2)
#endif /* LIBXML_SAX1_ENABLED */
        name = xmlParseStartTag2(ctxt, &prefix, &URI, &tlen);
#ifdef LIBXML_SAX1_ENABLED
    else
	name = xmlParseStartTag(ctxt);
#endif /* LIBXML_SAX1_ENABLED */
    if (ctxt->instate == XML_PARSER_EOF)
	return(-1);
    if (name == NULL) {
	spacePop(ctxt);
        return(-1);
    }
    nameNsPush(ctxt, name, prefix, URI, line, ctxt->nsNr - nsNr);
    ret = ctxt->node;

#ifdef LIBXML_VALID_ENABLED
    /*
     * [ VC: Root Element Type ]
     * The Name in the document type declaration must match the element
     * type of the root element.
     */
    if (ctxt->validate && ctxt->wellFormed && ctxt->myDoc &&
        ctxt->node && (ctxt->node == ctxt->myDoc->children))
        ctxt->valid &= xmlValidateRoot(&ctxt->vctxt, ctxt->myDoc);
#endif /* LIBXML_VALID_ENABLED */

    /*
     * Check for an Empty Element.
     */
    if ((RAW == '/') && (NXT(1) == '>')) {
        SKIP(2);
	if (ctxt->sax2) {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElementNs != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElementNs(ctxt->userData, name, prefix, URI);
#ifdef LIBXML_SAX1_ENABLED
	} else {
	    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
		(!ctxt->disableSAX))
		ctxt->sax->endElement(ctxt->userData, name);
#endif /* LIBXML_SAX1_ENABLED */
	}
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(1);
    }
    if (RAW == '>') {
        NEXT1;
    } else {
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_GT_REQUIRED,
		     "Couldn't find end of Start Tag %s line %d\n",
		                name, line, NULL);

	/*
	 * end of parsing of this node.
	 */
	nodePop(ctxt);
	namePop(ctxt);
	spacePop(ctxt);
	if (nsNr != ctxt->nsNr)
	    nsPop(ctxt, ctxt->nsNr - nsNr);

	/*
	 * Capture end position and add node
	 */
	if ( ret != NULL && ctxt->record_info ) {
	   node_info.end_pos = ctxt->input->consumed +
			      (CUR_PTR - ctxt->input->base);
	   node_info.end_line = ctxt->input->line;
	   node_info.node = ret;
	   xmlParserAddNodeInfo(ctxt, &node_info);
	}
	return(-1);
    }

    return(0);
}